

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O0

void __thiscall
Eigen::
CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>
::CwiseBinaryOp(CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>
                *this,Lhs *aLhs,Rhs *aRhs,scalar_product_op<float,_float> *func)

{
  Index IVar1;
  Index IVar2;
  bool bVar3;
  scalar_product_op<float,_float> *func_local;
  Rhs *aRhs_local;
  Lhs *aLhs_local;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>_>
  *this_local;
  
  CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_Eigen::Dense>
  ::CwiseBinaryOpImpl((CwiseBinaryOpImpl<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_1,_1,_false>_>,_const_Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_Eigen::Dense>
                       *)this);
  Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>
  ::Transpose(&this->m_lhs,aLhs);
  Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>
  ::Block(&this->m_rhs,aRhs);
  internal::scalar_product_op<float,_float>::scalar_product_op
            ((scalar_product_op<float,_float> *)&this->field_0xd0,func);
  IVar1 = Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>
          ::rows(aLhs);
  IVar2 = MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_0>
          ::rows((MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_0>
                  *)aRhs);
  bVar3 = false;
  if (IVar1 == IVar2) {
    IVar1 = Transpose<const_Eigen::Block<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_1,_1,_false>_>
            ::cols(aLhs);
    IVar2 = MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_0>
            ::cols((MapBase<Eigen::Block<const_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1,_1,_false>,_0>
                    *)aRhs);
    bVar3 = IVar1 == IVar2;
  }
  if (!bVar3) {
    __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                  ,0x74,
                  "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>>, 1, 1>>, const Eigen::Block<const Eigen::Map<Eigen::Matrix<float, 1, 1, 1, 1, 1>>, 1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<float>, Lhs = const Eigen::Transpose<const Eigen::Block<const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>, const Eigen::Matrix<float, -1, 1>>, const Eigen::Block<Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1>>, 1, 1>>, Rhs = const Eigen::Block<const Eigen::Map<Eigen::Matrix<float, 1, 1, 1, 1, 1>>, 1, 1>]"
                 );
  }
  return;
}

Assistant:

CwiseBinaryOp(const Lhs& aLhs, const Rhs& aRhs, const BinaryOp& func = BinaryOp())
      : m_lhs(aLhs), m_rhs(aRhs), m_functor(func)
    {
      EIGEN_CHECK_BINARY_COMPATIBILIY(BinaryOp,typename Lhs::Scalar,typename Rhs::Scalar);
      // require the sizes to match
      EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(Lhs, Rhs)
      eigen_assert(aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols());
    }